

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-inl.h
# Opt level: O0

Index __thiscall
wabt::interp::FreeList<wabt::interp::Ref>::New<wabt::interp::Ref&>
          (FreeList<wabt::interp::Ref> *this,Ref *args)

{
  size_t sVar1;
  bool bVar2;
  size_type sVar3;
  FreeList<wabt::interp::Ref> *index_00;
  reference pvVar4;
  Index index;
  Ref *local_20;
  Ref *args_local;
  FreeList<wabt::interp::Ref> *this_local;
  
  local_20 = args;
  args_local = (Ref *)this;
  if (this->free_head_ == 0) {
    index = args->index;
    std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::push_back
              (&this->list_,(value_type *)&index);
    sVar3 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::size(&this->list_);
    this_local = (FreeList<wabt::interp::Ref> *)(sVar3 - 1);
  }
  else {
    index_00 = (FreeList<wabt::interp::Ref> *)(this->free_head_ - 1);
    bVar2 = IsUsed(this,(Index)index_00);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      __assert_fail("!IsUsed(index)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/interp/interp-inl.h"
                    ,0xa0,
                    "Index wabt::interp::FreeList<wabt::interp::Ref>::New(Args &&...) [T = wabt::interp::Ref, Args = <wabt::interp::Ref &>]"
                   );
    }
    if (this->free_items_ == 0) {
      __assert_fail("free_items_ > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/interp/interp-inl.h"
                    ,0xa1,
                    "Index wabt::interp::FreeList<wabt::interp::Ref>::New(Args &&...) [T = wabt::interp::Ref, Args = <wabt::interp::Ref &>]"
                   );
    }
    pvVar4 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                       (&this->list_,(size_type)index_00);
    this->free_head_ = pvVar4->index & 0x7fffffffffffffff;
    sVar1 = local_20->index;
    pvVar4 = std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::operator[]
                       (&this->list_,(size_type)index_00);
    pvVar4->index = sVar1;
    this->free_items_ = this->free_items_ - 1;
    this_local = index_00;
  }
  return (Index)this_local;
}

Assistant:

auto FreeList<Ref>::New(Args&&... args) -> Index {
  if (free_head_ == 0) {
    list_.push_back(Ref(std::forward<Args>(args)...));
    return list_.size() - 1;
  }

  Index index = free_head_ - 1;

  assert(!IsUsed(index));
  assert(free_items_ > 0);

  free_head_ = list_[index].index & (refFreeBit - 1);
  list_[index] = Ref(std::forward<Args>(args)...);
  free_items_--;
  return index;
}